

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O1

void av1_svc_reset_temporal_layers(AV1_COMP *cpi,int is_key)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  lVar2 = (long)(cpi->svc).number_spatial_layers;
  if (0 < lVar2) {
    uVar1 = (cpi->svc).number_temporal_layers;
    lVar3 = 0x3354;
    lVar4 = 0;
    do {
      uVar5 = (ulong)uVar1;
      lVar6 = lVar3;
      if (0 < (int)uVar1) {
        do {
          if (is_key != 0) {
            *(undefined4 *)((long)&(((cpi->svc).layer_context)->rc).base_frame_target + lVar6) = 0;
          }
          lVar6 = lVar6 + 0x3380;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + (ulong)uVar1 * 0x3380;
    } while (lVar4 != lVar2);
  }
  av1_update_temporal_layer_framerate(cpi);
  av1_restore_layer_context(cpi);
  return;
}

Assistant:

void av1_svc_reset_temporal_layers(AV1_COMP *const cpi, int is_key) {
  SVC *const svc = &cpi->svc;
  LAYER_CONTEXT *lc = NULL;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      lc = &cpi->svc.layer_context[sl * svc->number_temporal_layers + tl];
      if (is_key) lc->frames_from_key_frame = 0;
    }
  }
  av1_update_temporal_layer_framerate(cpi);
  av1_restore_layer_context(cpi);
}